

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# soul_heart_Parser.h
# Opt level: O1

BinaryOperator * __thiscall
soul::heart::Parser::parseBinaryOp(Parser *this,FunctionParseState *state,Op opType)

{
  Module *pMVar1;
  bool bVar2;
  int iVar3;
  Expression *args_1;
  Expression *args_2;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  BinaryOperator *pBVar4;
  undefined4 extraout_var_01;
  undefined4 extraout_var_02;
  undefined4 extraout_var_03;
  undefined4 extraout_var_04;
  CodeLocation pos;
  BinaryOperatorTypes binOpTypes;
  undefined4 in_stack_fffffffffffffee0;
  CodeLocation local_118;
  undefined1 local_108 [24];
  Type local_f0;
  char *local_d8;
  string local_d0;
  string local_b0;
  CompileMessage local_90;
  CompileMessage local_58;
  Type *this_00;
  
  local_118.sourceCode.object =
       (this->
       super_Tokeniser<soul::DummyKeywordMatcher,_soul::HEARTOperator::Matcher,_soul::IdentifierMatcher>
       ).location.sourceCode.object;
  if (local_118.sourceCode.object != (SourceCodeText *)0x0) {
    ((local_118.sourceCode.object)->super_RefCountedObject).refCount =
         ((local_118.sourceCode.object)->super_RefCountedObject).refCount + 1;
  }
  local_118.location.data =
       (this->
       super_Tokeniser<soul::DummyKeywordMatcher,_soul::HEARTOperator::Matcher,_soul::IdentifierMatcher>
       ).location.location.data;
  Tokeniser<soul::DummyKeywordMatcher,_soul::HEARTOperator::Matcher,_soul::IdentifierMatcher>::
  expect<soul::TokenType>
            (&this->
              super_Tokeniser<soul::DummyKeywordMatcher,_soul::HEARTOperator::Matcher,_soul::IdentifierMatcher>
             ,(TokenType)0x2af3de);
  args_1 = parseExpression(this,state);
  Tokeniser<soul::DummyKeywordMatcher,_soul::HEARTOperator::Matcher,_soul::IdentifierMatcher>::
  expect<soul::TokenType>
            (&this->
              super_Tokeniser<soul::DummyKeywordMatcher,_soul::HEARTOperator::Matcher,_soul::IdentifierMatcher>
             ,(TokenType)0x289d49);
  args_2 = parseExpression(this,state);
  Tokeniser<soul::DummyKeywordMatcher,_soul::HEARTOperator::Matcher,_soul::IdentifierMatcher>::
  expect<soul::TokenType>
            (&this->
              super_Tokeniser<soul::DummyKeywordMatcher,_soul::HEARTOperator::Matcher,_soul::IdentifierMatcher>
             ,(TokenType)0x2acfd0);
  iVar3 = (*(args_1->super_Object)._vptr_Object[2])(args_1);
  this_00 = (Type *)CONCAT44(extraout_var,iVar3);
  iVar3 = (*(args_2->super_Object)._vptr_Object[2])(args_2);
  bVar2 = Type::isEqual(this_00,(Type *)CONCAT44(extraout_var_00,iVar3),1);
  if (!bVar2) {
    local_b0._M_dataplus._M_p = BinaryOp::getSymbol(opType);
    iVar3 = (*(args_1->super_Object)._vptr_Object[2])(args_1);
    Type::getDescription_abi_cxx11_((string *)local_108,(Type *)CONCAT44(extraout_var_01,iVar3));
    iVar3 = (*(args_2->super_Object)._vptr_Object[2])(args_2);
    Type::getDescription_abi_cxx11_(&local_d0,(Type *)CONCAT44(extraout_var_02,iVar3));
    CompileMessageHelpers::createMessage<char_const*,std::__cxx11::string,std::__cxx11::string>
              (&local_58,(CompileMessageHelpers *)0x1,none,0x2ac7a2,(char *)&local_b0,
               (char **)local_108,&local_d0,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               CONCAT44(opType,in_stack_fffffffffffffee0));
    CodeLocation::throwError(&local_118,&local_58);
  }
  if ((opType & ~subtract) == logicalOr) {
    TypeRules::getTypesForLogicalOp((BinaryOperatorTypes *)local_108,this_00,this_00);
  }
  else if ((opType < unknown) && ((0x700e0U >> (opType & (leftShift|greaterThanOrEqual)) & 1) != 0))
  {
    TypeRules::getTypesForBitwiseOp((BinaryOperatorTypes *)local_108,this_00,this_00);
  }
  else if ((opType & ~subtract) == equals) {
    TypeRules::getTypesForEqualityOp((BinaryOperatorTypes *)local_108,this_00,this_00);
  }
  else if ((opType & ~divide) == lessThan) {
    TypeRules::getTypesForComparisonOp((BinaryOperatorTypes *)local_108,this_00,this_00);
  }
  else {
    if (modulo < opType) {
      throwInternalCompilerError("getTypes",0xc3);
    }
    TypeRules::getTypesForArithmeticOp((BinaryOperatorTypes *)local_108,this_00,this_00,false);
  }
  bVar2 = Type::isEqual(&local_f0,this_00,1);
  if (bVar2) {
    pMVar1 = (this->module).object;
    if (pMVar1 != (Module *)0x0) {
      pBVar4 = PoolAllocator::
               allocate<soul::heart::BinaryOperator,soul::CodeLocation&,soul::heart::Expression&,soul::heart::Expression&,soul::BinaryOp::Op&>
                         (&pMVar1->allocator->pool,&local_118,args_1,args_2,
                          (Op *)&stack0xfffffffffffffee4);
      RefCountedPtr<soul::Structure>::decIfNotNull(local_f0.structure.object);
      RefCountedPtr<soul::Structure>::decIfNotNull((Structure *)local_108._16_8_);
      RefCountedPtr<soul::SourceCodeText>::decIfNotNull(local_118.sourceCode.object);
      return pBVar4;
    }
    throwInternalCompilerError("object != nullptr","operator->",0x3c);
  }
  local_d8 = BinaryOp::getSymbol(opType);
  iVar3 = (*(args_1->super_Object)._vptr_Object[2])(args_1);
  Type::getDescription_abi_cxx11_(&local_d0,(Type *)CONCAT44(extraout_var_03,iVar3));
  iVar3 = (*(args_2->super_Object)._vptr_Object[2])(args_2);
  Type::getDescription_abi_cxx11_(&local_b0,(Type *)CONCAT44(extraout_var_04,iVar3));
  CompileMessageHelpers::createMessage<char_const*,std::__cxx11::string,std::__cxx11::string>
            (&local_90,(CompileMessageHelpers *)0x1,none,0x2ac7a2,(char *)&local_d8,
             (char **)&local_d0,&local_b0,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT44(opType,in_stack_fffffffffffffee0));
  CodeLocation::throwError(&local_118,&local_90);
}

Assistant:

heart::BinaryOperator& parseBinaryOp (const FunctionParseState& state, BinaryOp::Op opType)
    {
        auto pos = location;
        expect (HEARTOperator::openParen);
        auto& lhs = parseExpression (state);
        expect (HEARTOperator::comma);
        auto& rhs = parseExpression (state);
        expect (HEARTOperator::closeParen);
        const auto& lhsType = lhs.getType();

        if (! lhsType.isEqual (rhs.getType(), Type::ignoreReferences))
            pos.throwError (Errors::illegalTypesForBinaryOperator (BinaryOp::getSymbol (opType),
                                                                   lhs.getType().getDescription(),
                                                                   rhs.getType().getDescription()));

        const auto& operandType = lhsType;
        auto binOpTypes = BinaryOp::getTypes (opType, operandType, operandType);

        if (! binOpTypes.operandType.isEqual (operandType, Type::ignoreReferences))
            pos.throwError (Errors::illegalTypesForBinaryOperator (BinaryOp::getSymbol (opType),
                                                                   lhs.getType().getDescription(),
                                                                   rhs.getType().getDescription()));

        return module->allocate<heart::BinaryOperator> (pos, lhs, rhs, opType);
    }